

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

void __thiscall
flatbuffers::java::JavaGenerator::GenEnum(JavaGenerator *this,EnumDef *enum_def,string *code)

{
  string *psVar1;
  bool bVar2;
  Value *pVVar3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar4;
  uint64_t uVar5;
  size_t sVar6;
  const_reference ppEVar7;
  reference ppEVar8;
  EnumVal *pEVar9;
  bool local_319;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ulong local_228;
  uint64_t k;
  EnumVal *ev_1;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_210;
  const_iterator it_1;
  EnumVal *prev;
  Type local_1f8;
  string local_1d8;
  uint64_t local_1b8;
  uint64_t range;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  Type local_150;
  string local_130;
  EnumVal *local_110;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_100;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *code_local;
  EnumDef *enum_def_local;
  JavaGenerator *this_local;
  
  if (((enum_def->super_Definition).generated & 1U) == 0) {
    local_20 = code;
    code_local = (string *)enum_def;
    enum_def_local = (EnumDef *)this;
    GenComment(&(enum_def->super_Definition).doc_comment,code,
               (CommentConfig *)(anonymous_namespace)::comment_config,"");
    std::__cxx11::string::operator+=((string *)local_20,"@SuppressWarnings(\"unused\")\n");
    psVar1 = code_local + 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"private",&local_41);
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                       ((SymbolTable<flatbuffers::Value> *)((long)&psVar1->field_2 + 8),&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    if (pVVar3 == (Value *)0x0) {
      std::__cxx11::string::operator+=((string *)local_20,"public ");
    }
    IdlNamer::Type_abi_cxx11_(&local_98,&this->namer_,(EnumDef *)code_local);
    std::operator+(&local_78,"final class ",&local_98);
    std::__cxx11::string::operator+=((string *)local_20,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::operator+=((string *)local_20," {\n");
    IdlNamer::Type_abi_cxx11_((string *)&it,&this->namer_,(EnumDef *)code_local);
    std::operator+(&local_d8,"  private ",(string *)&it);
    std::operator+(&local_b8,&local_d8,"() { }\n");
    std::__cxx11::string::operator+=((string *)local_20,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&it);
    pvVar4 = EnumDef::Vals((EnumDef *)code_local);
    local_100._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar4)
    ;
    while( true ) {
      pvVar4 = EnumDef::Vals((EnumDef *)code_local);
      ev = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar4)
      ;
      bVar2 = __gnu_cxx::operator!=
                        (&local_100,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev);
      if (!bVar2) break;
      ppEVar8 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_100);
      local_110 = *ppEVar8;
      GenComment(&local_110->doc_comment,local_20,
                 (CommentConfig *)(anonymous_namespace)::comment_config,"  ");
      std::__cxx11::string::operator+=((string *)local_20,"  public static final ");
      DestinationType(&local_150,this,(Type *)&code_local[6].field_2,false);
      GenTypeBasic_abi_cxx11_(&local_130,this,&local_150);
      std::__cxx11::string::operator+=((string *)local_20,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::operator+=((string *)local_20," ");
      IdlNamer::Variant_abi_cxx11_(&local_190,&this->namer_,local_110);
      std::operator+(&local_170,&local_190," = ");
      std::__cxx11::string::operator+=((string *)local_20,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      EnumDef::ToString_abi_cxx11_((string *)&range,(EnumDef *)code_local,local_110);
      std::__cxx11::string::operator+=((string *)local_20,(string *)&range);
      std::__cxx11::string::~string((string *)&range);
      if ((*(int *)&code_local[6].field_2 == 9) || (*(int *)&code_local[6].field_2 == 10)) {
        std::__cxx11::string::operator+=((string *)local_20,"L");
      }
      std::__cxx11::string::operator+=((string *)local_20,";\n");
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_100);
    }
    uVar5 = EnumDef::Distance((EnumDef *)code_local);
    local_1b8 = uVar5;
    sVar6 = EnumDef::size((EnumDef *)code_local);
    local_319 = false;
    if (uVar5 / sVar6 < 5) {
      DestinationType(&local_1f8,this,(Type *)&code_local[6].field_2,false);
      GenTypeBasic_abi_cxx11_(&local_1d8,this,&local_1f8);
      local_319 = std::operator!=(&local_1d8,"long");
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    if (local_319 != false) {
      std::__cxx11::string::operator+=((string *)local_20,"\n  public static final String");
      std::__cxx11::string::operator+=((string *)local_20,"[] names = { ");
      pvVar4 = EnumDef::Vals((EnumDef *)code_local);
      ppEVar7 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::front
                          (pvVar4);
      it_1._M_current = (EnumVal **)*ppEVar7;
      pvVar4 = EnumDef::Vals((EnumDef *)code_local);
      local_210._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (pvVar4);
      while( true ) {
        pvVar4 = EnumDef::Vals((EnumDef *)code_local);
        ev_1 = (EnumVal *)
               std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                         (pvVar4);
        bVar2 = __gnu_cxx::operator!=
                          (&local_210,
                           (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                            *)&ev_1);
        if (!bVar2) break;
        ppEVar8 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_210);
        k = (uint64_t)*ppEVar8;
        for (local_228 = EnumDef::Distance((EnumDef *)code_local,(EnumVal *)it_1._M_current,
                                           (EnumVal *)k); 1 < local_228; local_228 = local_228 - 1)
        {
          std::__cxx11::string::operator+=((string *)local_20,"\"\", ");
        }
        it_1._M_current = (EnumVal **)k;
        IdlNamer::Variant_abi_cxx11_(&local_288,&this->namer_,(EnumVal *)k);
        std::operator+(&local_268,"\"",&local_288);
        std::operator+(&local_248,&local_268,"\", ");
        std::__cxx11::string::operator+=((string *)local_20,(string *)&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_210);
      }
      std::__cxx11::string::operator+=((string *)local_20,"};\n\n");
      std::__cxx11::string::operator+=((string *)local_20,"  public static ");
      std::__cxx11::string::operator+=((string *)local_20,"String");
      std::__cxx11::string::operator+=((string *)local_20," name");
      std::__cxx11::string::operator+=((string *)local_20,"(int e) { return names[e");
      pEVar9 = EnumDef::MinValue((EnumDef *)code_local);
      bVar2 = EnumVal::IsNonZero(pEVar9);
      if (bVar2) {
        pEVar9 = EnumDef::MinValue((EnumDef *)code_local);
        Namer::Variant(&local_2c8,&(this->namer_).super_Namer,&pEVar9->name);
        std::operator+(&local_2a8," - ",&local_2c8);
        std::__cxx11::string::operator+=((string *)local_20,(string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
      }
      std::__cxx11::string::operator+=((string *)local_20,"]; }\n");
    }
    std::__cxx11::string::operator+=((string *)local_20,"}\n\n");
  }
  return;
}

Assistant:

void GenEnum(EnumDef &enum_def, std::string &code) const {
    if (enum_def.generated) return;

    // Generate enum definitions of the form:
    // public static (final) int name = value;
    // In Java, we use ints rather than the Enum feature, because we want them
    // to map directly to how they're used in C/C++ and file formats.
    // That, and Java Enums are expensive, and not universally liked.
    GenComment(enum_def.doc_comment, &code, &comment_config);

    code += "@SuppressWarnings(\"unused\")\n";
    if (enum_def.attributes.Lookup("private")) {
      // For Java, we leave the enum unmarked to indicate package-private
    } else {
      code += "public ";
    }
    code += "final class " + namer_.Type(enum_def);
    code += " {\n";
    code += "  private " + namer_.Type(enum_def) + "() { }\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, &code, &comment_config, "  ");
      code += "  public static final ";
      code += GenTypeBasic(DestinationType(enum_def.underlying_type, false));
      code += " ";
      code += namer_.Variant(ev) + " = ";
      code += enum_def.ToString(ev);
      if (enum_def.underlying_type.base_type == BASE_TYPE_LONG ||
          enum_def.underlying_type.base_type == BASE_TYPE_ULONG) {
        code += "L";
      }
      code += ";\n";
    }

    // Generate a string table for enum values.
    // Problem is, if values are very sparse that could generate really big
    // tables. Ideally in that case we generate a map lookup instead, but for
    // the moment we simply don't output a table at all.
    auto range = enum_def.Distance();
    // Average distance between values above which we consider a table
    // "too sparse". Change at will.
    static const uint64_t kMaxSparseness = 5;
    if (range / static_cast<uint64_t>(enum_def.size()) < kMaxSparseness &&
        GenTypeBasic(DestinationType(enum_def.underlying_type, false)) !=
            "long") {
      code += "\n  public static final String";
      code += "[] names = { ";
      const EnumVal *prev = enum_def.Vals().front();
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        const EnumVal &ev = **it;
        for (auto k = enum_def.Distance(prev, &ev); k > 1; --k)
          code += "\"\", ";
        prev = &ev;
        code += "\"" + namer_.Variant(ev) + "\", ";
      }
      code += "};\n\n";
      code += "  public static ";
      code += "String";
      code += " name";
      code += "(int e) { return names[e";
      if (enum_def.MinValue()->IsNonZero())
        code += " - " + namer_.Variant(enum_def.MinValue()->name);
      code += "]; }\n";
    }

    // Close the class
    code += "}\n\n";
  }